

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::~Image
          (Image<float,_gimage::PixelTraits<float>_> *this)

{
  long in_RDI;
  
  if ((-1 < *(long *)(in_RDI + 0x18)) && (*(void **)(in_RDI + 0x20) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x20));
  }
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x28));
  }
  if (*(void **)(in_RDI + 0x30) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x30));
  }
  return;
}

Assistant:

~Image()
    {
      if (n >= 0)
      {
        delete [] pixel;
      }

      delete [] row;
      delete [] img;
    }